

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcppacketbuilder.cpp
# Opt level: O2

void __thiscall
jrtplib::RTCPPacketBuilder::RTCPPacketBuilder
          (RTCPPacketBuilder *this,RTPSources *s,RTPPacketBuilder *pb,RTPMemoryManager *mgr)

{
  (this->super_RTPMemoryObject).mgr = mgr;
  (this->super_RTPMemoryObject)._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTCPPacketBuilder_00145938;
  this->sources = s;
  this->rtppacketbuilder = pb;
  (this->prevbuildtime).m_t = 0.0;
  (this->transmissiondelay).m_t = 0.0;
  RTCPSDESInfoInternal::RTCPSDESInfoInternal(&this->ownsdesinfo,mgr);
  this->init = false;
  timeinit = timeinit + 1;
  return;
}

Assistant:

RTCPPacketBuilder::RTCPPacketBuilder(RTPSources &s,RTPPacketBuilder &pb,RTPMemoryManager *mgr)
	: RTPMemoryObject(mgr),sources(s),rtppacketbuilder(pb),prevbuildtime(0,0),transmissiondelay(0,0),ownsdesinfo(mgr)
{
	init = false;
	timeinit.Dummy();
}